

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int ARKodeGetDky(void *arkode_mem,sunrealtype t,int k,N_Vector dky)

{
  double dVar1;
  double dVar2;
  int error_code;
  int line;
  char *msgfmt;
  double dVar3;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x465;
  }
  else if (dky == (N_Vector)0x0) {
    msgfmt = "dky = NULL illegal.";
    error_code = -0x1a;
    line = 0x46e;
  }
  else if (*(ARKInterp *)((long)arkode_mem + 0x278) == (ARKInterp)0x0) {
    msgfmt = "Missing interpolation structure";
    error_code = -0x15;
    line = 0x474;
  }
  else {
    dVar1 = *(double *)((long)arkode_mem + 0x2d0);
    dVar2 = *(double *)((long)arkode_mem + 0x370);
    dVar3 = (ABS(dVar2) + ABS(dVar1)) * *(double *)((long)arkode_mem + 8) * 100.0;
    dVar3 = (double)(-(ulong)(dVar2 < 0.0) & (ulong)-dVar3 | ~-(ulong)(dVar2 < 0.0) & (ulong)dVar3);
    if (0.0 < (t - (dVar3 + dVar1)) * (t - ((dVar1 - dVar2) - dVar3))) {
      arkProcessError((ARKodeMem)arkode_mem,-0x19,0x481,"ARKodeGetDky",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                      ,
                      "Illegal value for t. t = %lg is not between tcur - hold = %lg and tcur = %lg."
                     );
      return -0x19;
    }
    error_code = arkInterpEvaluate((ARKodeMem_conflict)arkode_mem,
                                   *(ARKInterp *)((long)arkode_mem + 0x278),
                                   (t - dVar1) / *(double *)((long)arkode_mem + 0x2a0),k,5,dky);
    if (error_code == 0) {
      return 0;
    }
    msgfmt = "Error calling arkInterpEvaluate";
    line = 0x48d;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeGetDky",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeGetDky(void* arkode_mem, sunrealtype t, int k, N_Vector dky)
{
  sunrealtype s, tfuzz, tp, tn1;
  int retval;
  ARKodeMem ark_mem;

  /* Check if ark_mem exists */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Check all inputs for legality */
  if (dky == NULL)
  {
    arkProcessError(ark_mem, ARK_BAD_DKY, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_DKY);
    return (ARK_BAD_DKY);
  }
  if (ark_mem->interp == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "Missing interpolation structure");
    return (ARK_MEM_NULL);
  }

  /* Allow for some slack */
  tfuzz = FUZZ_FACTOR * ark_mem->uround *
          (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->hold));
  if (ark_mem->hold < ZERO) { tfuzz = -tfuzz; }
  tp  = ark_mem->tcur - ark_mem->hold - tfuzz;
  tn1 = ark_mem->tcur + tfuzz;
  if ((t - tp) * (t - tn1) > ZERO)
  {
    arkProcessError(ark_mem, ARK_BAD_T, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_T, t, ark_mem->tcur - ark_mem->hold,
                    ark_mem->tcur);
    return (ARK_BAD_T);
  }

  /* call arkInterpEvaluate to evaluate result */
  s      = (t - ark_mem->tcur) / ark_mem->h;
  retval = arkInterpEvaluate(ark_mem, ark_mem->interp, s, k,
                             ARK_INTERP_MAX_DEGREE, dky);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error calling arkInterpEvaluate");
    return (retval);
  }
  return (ARK_SUCCESS);
}